

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_range(Curl_easy *data,Curl_HttpReq httpreq)

{
  char *pcVar1;
  curl_off_t cVar2;
  long lVar3;
  char *format;
  
  if (((data->state).field_0x775 & 1) == 0) {
    return CURLE_OK;
  }
  switch(httpreq) {
  case HTTPREQ_GET:
  case HTTPREQ_HEAD:
    break;
  case HTTPREQ_POST:
  case HTTPREQ_PUT:
    goto switchD_00132a44_caseD_1;
  default:
    return CURLE_OK;
  }
  pcVar1 = Curl_checkheaders(data,"Range",5);
  if (pcVar1 == (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.rangeline);
    pcVar1 = curl_maprintf("Range: bytes=%s\r\n",(data->state).range);
    (data->state).aptr.rangeline = pcVar1;
    return CURLE_OK;
  }
  if ((httpreq != HTTPREQ_PUT) && (httpreq != HTTPREQ_POST)) {
    return CURLE_OK;
  }
switchD_00132a44_caseD_1:
  pcVar1 = Curl_checkheaders(data,"Content-Range",0xd);
  if (pcVar1 != (char *)0x0) {
    return CURLE_OK;
  }
  cVar2 = Curl_creader_total_length(data);
  (*Curl_cfree)((data->state).aptr.rangeline);
  if ((data->set).set_resume_from < 0) {
    pcVar1 = (char *)(cVar2 + -1);
    format = "Content-Range: bytes 0-%ld/%ld\r\n";
  }
  else {
    lVar3 = (data->state).resume_from;
    if (lVar3 != 0) {
      if (((data->req).field_0xdb & 4) == 0) {
        lVar3 = lVar3 + cVar2;
      }
      else {
        lVar3 = (data->state).infilesize;
      }
      pcVar1 = curl_maprintf("Content-Range: bytes %s%ld/%ld\r\n",(data->state).range,lVar3 + -1);
      goto LAB_00132b3c;
    }
    pcVar1 = (data->state).range;
    format = "Content-Range: bytes %s/%ld\r\n";
  }
  pcVar1 = curl_maprintf(format,pcVar1,cVar2);
LAB_00132b3c:
  (data->state).aptr.rangeline = pcVar1;
  if (pcVar1 != (char *)0x0) {
    return CURLE_OK;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_http_range(struct Curl_easy *data,
                         Curl_HttpReq httpreq)
{
  if(data->state.use_range) {
    /*
     * A range is selected. We use different headers whether we are downloading
     * or uploading and we always let customized headers override our internal
     * ones if any such are specified.
     */
    if(((httpreq == HTTPREQ_GET) || (httpreq == HTTPREQ_HEAD)) &&
       !Curl_checkheaders(data, STRCONST("Range"))) {
      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);
      data->state.aptr.rangeline = aprintf("Range: bytes=%s\r\n",
                                           data->state.range);
    }
    else if((httpreq == HTTPREQ_POST || httpreq == HTTPREQ_PUT) &&
            !Curl_checkheaders(data, STRCONST("Content-Range"))) {
      curl_off_t req_clen = Curl_creader_total_length(data);
      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);

      if(data->set.set_resume_from < 0) {
        /* Upload resume was asked for, but we do not know the size of the
           remote part so we tell the server (and act accordingly) that we
           upload the whole file (again) */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes 0-%" FMT_OFF_T "/%" FMT_OFF_T "\r\n",
                  req_clen - 1, req_clen);

      }
      else if(data->state.resume_from) {
        /* This is because "resume" was selected */
        /* TODO: not sure if we want to send this header during authentication
         * negotiation, but test1084 checks for it. In which case we have a
         * "null" client reader installed that gives an unexpected length. */
        curl_off_t total_len = data->req.authneg ?
                               data->state.infilesize :
                               (data->state.resume_from + req_clen);
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s%" FMT_OFF_T "/%" FMT_OFF_T "\r\n",
                  data->state.range, total_len-1, total_len);
      }
      else {
        /* Range was selected and then we just pass the incoming range and
           append total size */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s/%" FMT_OFF_T "\r\n",
                  data->state.range, req_clen);
      }
      if(!data->state.aptr.rangeline)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}